

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O2

FT_ULong ft_gzip_file_io(FT_GZipFile zip,FT_ULong pos,FT_Byte *buffer,FT_ULong count)

{
  FT_Error FVar1;
  ulong uVar2;
  FT_ULong FVar3;
  ulong uVar4;
  
  uVar2 = zip->pos;
  if (pos < uVar2) {
    FVar1 = FT_Stream_Seek(zip->source,zip->start);
    if (FVar1 != 0) {
      return 0;
    }
    inflateReset(&zip->zstream);
    (zip->zstream).avail_in = 0;
    (zip->zstream).next_in = zip->input;
    (zip->zstream).avail_out = 0;
    (zip->zstream).next_out = zip->buffer;
    zip->limit = (FT_Byte *)&zip->pos;
    zip->cursor = (FT_Byte *)&zip->pos;
    zip->pos = 0;
    uVar2 = 0;
  }
  uVar4 = pos - uVar2;
  if (uVar2 <= pos && uVar4 != 0) {
    while( true ) {
      uVar2 = (long)zip->limit - (long)zip->cursor;
      if (uVar4 <= uVar2) {
        uVar2 = uVar4;
      }
      zip->cursor = zip->cursor + uVar2;
      zip->pos = zip->pos + uVar2;
      uVar4 = uVar4 - uVar2;
      if (uVar4 == 0) break;
      FVar1 = ft_gzip_file_fill_output(zip);
      if (FVar1 != 0) {
        return 0;
      }
    }
  }
  if (count == 0) {
    return 0;
  }
  FVar3 = 0;
  while( true ) {
    uVar2 = (long)zip->limit - (long)zip->cursor;
    if (count <= uVar2) {
      uVar2 = count;
    }
    memcpy(buffer,zip->cursor,uVar2);
    FVar3 = FVar3 + uVar2;
    zip->cursor = zip->cursor + uVar2;
    zip->pos = zip->pos + uVar2;
    count = count - uVar2;
    if (count == 0) break;
    buffer = buffer + uVar2;
    FVar1 = ft_gzip_file_fill_output(zip);
    if (FVar1 != 0) {
      return FVar3;
    }
  }
  return FVar3;
}

Assistant:

static FT_ULong
  ft_gzip_file_io( FT_GZipFile  zip,
                   FT_ULong     pos,
                   FT_Byte*     buffer,
                   FT_ULong     count )
  {
    FT_ULong  result = 0;
    FT_Error  error;


    /* Reset inflate stream if we're seeking backwards.        */
    /* Yes, that is not too efficient, but it saves memory :-) */
    if ( pos < zip->pos )
    {
      error = ft_gzip_file_reset( zip );
      if ( error )
        goto Exit;
    }

    /* skip unwanted bytes */
    if ( pos > zip->pos )
    {
      error = ft_gzip_file_skip_output( zip, (FT_ULong)( pos - zip->pos ) );
      if ( error )
        goto Exit;
    }

    if ( count == 0 )
      goto Exit;

    /* now read the data */
    for (;;)
    {
      FT_ULong  delta;


      delta = (FT_ULong)( zip->limit - zip->cursor );
      if ( delta >= count )
        delta = count;

      FT_MEM_COPY( buffer, zip->cursor, delta );
      buffer      += delta;
      result      += delta;
      zip->cursor += delta;
      zip->pos    += delta;

      count -= delta;
      if ( count == 0 )
        break;

      error = ft_gzip_file_fill_output( zip );
      if ( error )
        break;
    }

  Exit:
    return result;
  }